

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

CURLcode Curl_http2_request_upgrade(dynbuf *req,Curl_easy *data)

{
  anon_union_248_5_a113b5f6_for_proto *httpc;
  connectdata *pcVar1;
  CURLcode CVar2;
  size_t insize;
  char *base64;
  size_t blen;
  
  pcVar1 = data->conn;
  httpc = &pcVar1->proto;
  populate_settings(data,&httpc->httpc);
  insize = nghttp2_pack_settings_payload
                     ((uint8_t *)httpc,0x50,(pcVar1->proto).httpc.local_settings,
                      (pcVar1->proto).httpc.local_settings_num);
  if ((long)insize < 1) {
    Curl_failf(data,"nghttp2 unexpectedly failed on pack_settings_payload");
    Curl_dyn_free(req);
    CVar2 = CURLE_FAILED_INIT;
  }
  else {
    (pcVar1->proto).httpc.binlen = insize;
    CVar2 = Curl_base64url_encode((char *)httpc,insize,&base64,&blen);
    if (CVar2 == CURLE_OK) {
      CVar2 = Curl_dyn_addf(req,
                            "Connection: Upgrade, HTTP2-Settings\r\nUpgrade: %s\r\nHTTP2-Settings: %s\r\n"
                            ,"h2c",base64);
      (*Curl_cfree)(base64);
      (data->req).upgr101 = UPGR101_H2;
    }
    else {
      Curl_dyn_free(req);
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_http2_request_upgrade(struct dynbuf *req,
                                    struct Curl_easy *data)
{
  CURLcode result;
  ssize_t binlen;
  char *base64;
  size_t blen;
  struct connectdata *conn = data->conn;
  struct SingleRequest *k = &data->req;
  uint8_t *binsettings = conn->proto.httpc.binsettings;
  struct http_conn *httpc = &conn->proto.httpc;

  populate_settings(data, httpc);

  /* this returns number of bytes it wrote */
  binlen = nghttp2_pack_settings_payload(binsettings, H2_BINSETTINGS_LEN,
                                         httpc->local_settings,
                                         httpc->local_settings_num);
  if(binlen <= 0) {
    failf(data, "nghttp2 unexpectedly failed on pack_settings_payload");
    Curl_dyn_free(req);
    return CURLE_FAILED_INIT;
  }
  conn->proto.httpc.binlen = binlen;

  result = Curl_base64url_encode((const char *)binsettings, binlen,
                                 &base64, &blen);
  if(result) {
    Curl_dyn_free(req);
    return result;
  }

  result = Curl_dyn_addf(req,
                         "Connection: Upgrade, HTTP2-Settings\r\n"
                         "Upgrade: %s\r\n"
                         "HTTP2-Settings: %s\r\n",
                         NGHTTP2_CLEARTEXT_PROTO_VERSION_ID, base64);
  free(base64);

  k->upgr101 = UPGR101_H2;

  return result;
}